

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

int ncnn::conv3x3s1_winograd23_int8_xop(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  int iVar1;
  Option *in_stack_00000700;
  int in_stack_0000070c;
  Mat *in_stack_00000710;
  Mat *in_stack_00000718;
  Mat *in_stack_00000720;
  
  iVar1 = conv3x3s1_winograd23_int8
                    (in_stack_00000720,in_stack_00000718,in_stack_00000710,in_stack_0000070c,
                     in_stack_00000700);
  return iVar1;
}

Assistant:

int conv3x3s1_winograd23_int8_xop(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
    return conv3x3s1_winograd23_int8(bottom_blob, top_blob, AT, nT, opt);
}